

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::InternalWriteMessageToArray
                  (int field_number,MessageLite *value,bool deterministic,uint8 *target)

{
  uint32 value_00;
  int iVar1;
  uint8 *puVar2;
  undefined4 extraout_var;
  uint8 *target_local;
  bool deterministic_local;
  MessageLite *value_local;
  int field_number_local;
  
  puVar2 = WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,target);
  value_00 = (*value->_vptr_MessageLite[0xf])();
  puVar2 = io::CodedOutputStream::WriteVarint32ToArray(value_00,puVar2);
  iVar1 = (*value->_vptr_MessageLite[0x10])(value,(ulong)deterministic,puVar2,deterministic);
  return (uint8 *)CONCAT44(extraout_var,iVar1);
}

Assistant:

inline uint8* WireFormatLite::InternalWriteMessageToArray(
    int field_number, const MessageLite& value, bool deterministic,
    uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(
    value.GetCachedSize(), target);
  return value.InternalSerializeWithCachedSizesToArray(deterministic, target);
}